

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_binsri_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t u5)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  uint local_34;
  uint32_t i;
  wr_t *pws;
  wr_t *pwd;
  uint32_t u5_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState *env_local;
  
  lVar1 = (ulong)wd * 0x10 + 0x228;
  lVar2 = (ulong)ws * 0x10 + 0x228;
  switch(df) {
  case 0:
    for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
      iVar3 = msa_binsr_df(df,(long)*(char *)((long)(env->active_fpu).fpr +
                                             (ulong)local_34 + lVar1 + -0x228),
                           (long)*(char *)((long)(env->active_fpu).fpr +
                                          (ulong)local_34 + lVar2 + -0x228),(ulong)u5);
      *(char *)((long)(env->active_fpu).fpr + (ulong)local_34 + lVar1 + -0x228) = (char)iVar3;
    }
    break;
  case 1:
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      iVar3 = msa_binsr_df(df,(long)*(short *)((long)(env->active_fpu).fpr +
                                              (ulong)local_34 * 2 + lVar1 + -0x228),
                           (long)*(short *)((long)(env->active_fpu).fpr +
                                           (ulong)local_34 * 2 + lVar2 + -0x228),(ulong)u5);
      *(short *)((long)(env->active_fpu).fpr + (ulong)local_34 * 2 + lVar1 + -0x228) = (short)iVar3;
    }
    break;
  case 2:
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar3 = msa_binsr_df(df,(long)*(int *)((long)(env->active_fpu).fpr +
                                            (ulong)local_34 * 4 + lVar1 + -0x228),
                           (long)*(int *)((long)(env->active_fpu).fpr +
                                         (ulong)local_34 * 4 + lVar2 + -0x228),(ulong)u5);
      *(int *)((long)(env->active_fpu).fpr + (ulong)local_34 * 4 + lVar1 + -0x228) = (int)iVar3;
    }
    break;
  case 3:
    for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
      iVar3 = msa_binsr_df(df,*(int64_t *)
                               ((long)(env->active_fpu).fpr + (ulong)local_34 * 8 + lVar1 + -0x228),
                           *(int64_t *)
                            ((long)(env->active_fpu).fpr + (ulong)local_34 * 8 + lVar2 + -0x228),
                           (ulong)u5);
      *(int64_t *)((long)(env->active_fpu).fpr + (ulong)local_34 * 8 + lVar1 + -0x228) = iVar3;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x11f2,
                  "void helper_msa_binsri_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  return;
}

Assistant:

static inline int64_t msa_subs_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (arg2 > 0) {
        return (min_int + arg2 < arg1) ? arg1 - arg2 : min_int;
    } else {
        return (arg1 < max_int + arg2) ? arg1 - arg2 : max_int;
    }
}